

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxweightst.hpp
# Opt level: O0

void soplex::initPrefs<double>
               (DataArray<soplex::SPxId> *pref,SPxSolverBase<double> *base,Array<double> *rowWeight,
               Array<double> *colWeight)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  double *pdVar5;
  SPxId *pSVar6;
  DataArray<int> *in_RSI;
  DataArray<soplex::SPxId> *in_RDI;
  Compare<double> compare;
  int k;
  int j;
  int i;
  DataArray<int> col;
  DataArray<int> row;
  int in_stack_fffffffffffffe9c;
  DataArray<int> *in_stack_fffffffffffffea0;
  DataKey in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  undefined4 in_stack_fffffffffffffeb8;
  undefined1 type;
  int iVar7;
  int in_stack_fffffffffffffebc;
  Compare<double> *in_stack_fffffffffffffec0;
  undefined8 in_stack_fffffffffffffec8;
  int end;
  int *in_stack_fffffffffffffed0;
  DataKey local_90;
  DataKey local_88;
  DataKey local_80;
  DataKey local_78;
  Compare<double> local_70;
  int local_68;
  int local_64;
  int local_60;
  DataArray<int> local_50;
  DataArray<int> local_38;
  DataArray<int> *local_10;
  DataArray<soplex::SPxId> *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  SPxLPBase<double>::nRows((SPxLPBase<double> *)0x1b5004);
  DataArray<int>::DataArray
            ((DataArray<int> *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
             in_stack_fffffffffffffea8.idx,in_stack_fffffffffffffea8.info,
             (Real)in_stack_fffffffffffffea0);
  SPxLPBase<double>::nCols((SPxLPBase<double> *)0x1b502a);
  DataArray<int>::DataArray
            ((DataArray<int> *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
             in_stack_fffffffffffffea8.idx,in_stack_fffffffffffffea8.info,
             (Real)in_stack_fffffffffffffea0);
  Compare<double>::Compare(&local_70);
  for (local_60 = 0; iVar7 = local_60,
      iVar2 = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x1b5088), iVar3 = local_60,
      iVar7 < iVar2; local_60 = local_60 + 1) {
    piVar4 = DataArray<int>::operator[](&local_38,local_60);
    *piVar4 = iVar3;
  }
  local_70.weight = Array<double>::get_const_ptr((Array<double> *)0x1b512d);
  DataArray<int>::get_ptr(&local_38);
  DataArray<int>::size(&local_38);
  SPxQuicksort<int,soplex::Compare<double>>
            (in_stack_fffffffffffffed0,(int)((ulong)in_stack_fffffffffffffec8 >> 0x20),
             in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,
             SUB41((uint)in_stack_fffffffffffffeb8 >> 0x18,0));
  local_60 = 0;
  while( true ) {
    iVar7 = local_60;
    iVar2 = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x1b51b8);
    iVar3 = local_60;
    end = (int)((ulong)in_stack_fffffffffffffec8 >> 0x20);
    type = (undefined1)((uint)in_stack_fffffffffffffeb8 >> 0x18);
    if (iVar2 <= iVar7) break;
    piVar4 = DataArray<int>::operator[](&local_50,local_60);
    *piVar4 = iVar3;
    local_60 = local_60 + 1;
  }
  local_70.weight = Array<double>::get_const_ptr((Array<double> *)0x1b521e);
  DataArray<int>::get_ptr(&local_50);
  DataArray<int>::size(&local_50);
  SPxQuicksort<int,soplex::Compare<double>>
            (in_stack_fffffffffffffed0,end,in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,
             (bool)type);
  local_60 = 0;
  local_64 = 0;
  local_68 = 0;
  while (iVar7 = local_68, iVar3 = DataArray<soplex::SPxId>::size(local_8), iVar7 < iVar3) {
    DataArray<int>::operator[](&local_38,local_60);
    pdVar5 = Array<double>::operator[]
                       ((Array<double> *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
    dVar1 = *pdVar5;
    DataArray<int>::operator[](&local_50,local_64);
    pdVar5 = Array<double>::operator[]
                       ((Array<double> *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
    iVar3 = local_60;
    iVar7 = local_64;
    if (*pdVar5 <= dVar1) {
      local_64 = local_64 + 1;
      DataArray<int>::operator[](&local_50,iVar7);
      local_88 = (DataKey)SPxLPBase<double>::cId
                                    ((SPxLPBase<double> *)in_stack_fffffffffffffea8,
                                     (int)((ulong)in_stack_fffffffffffffea0 >> 0x20));
      iVar7 = local_68;
      local_68 = local_68 + 1;
      pSVar6 = DataArray<soplex::SPxId>::operator[](local_8,iVar7);
      SPxId::operator=(pSVar6,(SPxColId *)&local_88);
      iVar7 = local_64;
      iVar3 = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x1b554a);
      if (iVar3 <= iVar7) {
        while (iVar3 = local_68, iVar2 = DataArray<soplex::SPxId>::size(local_8), iVar7 = local_60,
              iVar3 < iVar2) {
          local_60 = local_60 + 1;
          in_stack_fffffffffffffea0 = local_10;
          DataArray<int>::operator[](&local_38,iVar7);
          in_stack_fffffffffffffea8 =
               (DataKey)SPxLPBase<double>::rId
                                  ((SPxLPBase<double> *)in_stack_fffffffffffffea8,
                                   (int)((ulong)in_stack_fffffffffffffea0 >> 0x20));
          iVar7 = local_68;
          local_68 = local_68 + 1;
          local_90 = in_stack_fffffffffffffea8;
          pSVar6 = DataArray<soplex::SPxId>::operator[](local_8,iVar7);
          SPxId::operator=(pSVar6,(SPxRowId *)&local_90);
        }
      }
    }
    else {
      local_60 = local_60 + 1;
      DataArray<int>::operator[](&local_38,iVar3);
      local_78 = (DataKey)SPxLPBase<double>::rId
                                    ((SPxLPBase<double> *)in_stack_fffffffffffffea8,
                                     (int)((ulong)in_stack_fffffffffffffea0 >> 0x20));
      iVar7 = local_68;
      local_68 = local_68 + 1;
      pSVar6 = DataArray<soplex::SPxId>::operator[](local_8,iVar7);
      SPxId::operator=(pSVar6,(SPxRowId *)&local_78);
      iVar7 = local_60;
      iVar3 = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x1b53e9);
      if (iVar3 <= iVar7) {
        while (iVar7 = local_68, iVar2 = DataArray<soplex::SPxId>::size(local_8), iVar3 = local_64,
              iVar7 < iVar2) {
          local_64 = local_64 + 1;
          DataArray<int>::operator[](&local_50,iVar3);
          local_80 = (DataKey)SPxLPBase<double>::cId
                                        ((SPxLPBase<double> *)in_stack_fffffffffffffea8,
                                         (int)((ulong)in_stack_fffffffffffffea0 >> 0x20));
          iVar7 = local_68;
          local_68 = local_68 + 1;
          pSVar6 = DataArray<soplex::SPxId>::operator[](local_8,iVar7);
          SPxId::operator=(pSVar6,(SPxColId *)&local_80);
        }
      }
    }
  }
  DataArray<int>::~DataArray(in_stack_fffffffffffffea0);
  DataArray<int>::~DataArray(in_stack_fffffffffffffea0);
  return;
}

Assistant:

static void initPrefs(
   DataArray < SPxId >&      pref,
   const SPxSolverBase<R>&       base,
   const Array<R>& rowWeight,
   const Array<R>& colWeight)
{
   DataArray<int> row(base.nRows());
   DataArray<int> col(base.nCols());
   int i;
   int j;
   int k;

   Compare<R> compare;
   //   compare.base = &base;

   for(i = 0; i < base.nRows(); ++i)
      row[i] = i;

   compare.weight = rowWeight.get_const_ptr();

#ifndef NDEBUG

   if(std::is_floating_point<R>::value)
   {
      for(int l = 0; l < row.size(); ++l)
      {
         // nan values cannot be handled in sorting
         assert(!isnan(compare.weight[l]));
         // the weight formulas should not produce inf values
         assert(!isinf(compare.weight[l]));
      }
   }

#endif

   SPxQuicksort(row.get_ptr(), row.size(), compare); // Sort rows

   for(i = 0; i < base.nCols(); ++i)
      col[i] = i;

   compare.weight = colWeight.get_const_ptr();

#ifndef NDEBUG

   if(std::is_floating_point<R>::value)
   {
      for(int l = 0; l < col.size(); ++l)
      {
         // nan values cannot be handled in sorting
         assert(!isnan(compare.weight[l]));
         // the weight formulas should not produce inf values
         assert(!isinf(compare.weight[l]));
      }
   }

#endif

   SPxQuicksort(col.get_ptr(), col.size(), compare); // Sort column

   i = 0;
   j = 0;
   k = 0;

   while(k < pref.size())            // merge sort
   {
      if(rowWeight[row[i]] < colWeight[col[j]])
      {
         pref[k++] = base.rId(row[i++]);

         if(i >= base.nRows())
            while(k < pref.size())
               pref[k++] = base.cId(col[j++]);
      }
      else
      {
         pref[k++] = base.cId(col[j++]);

         if(j >= base.nCols())
            while(k < pref.size())
               pref[k++] = base.rId(row[i++]);
      }
   }

   assert(i == base.nRows());
   assert(j == base.nCols());
}